

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferPoolTest.cpp
# Opt level: O0

void __thiscall BufferPool_Grind_Test::~BufferPool_Grind_Test(BufferPool_Grind_Test *this)

{
  BufferPool_Grind_Test *this_local;
  
  ~BufferPool_Grind_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(BufferPool, Grind) {
  memt::BufferPool pool(1001);
  std::list<void*> ptrs;
  for (size_t i = 0; i < 10; ++i) {
    for (size_t j = 0; j < 100; ++j)
      ptrs.push_back(pool.alloc());
    // free most but not all and in FIFO order
    for (size_t j = 0; j < 90; ++j) {
      pool.free(ptrs.front());
      ptrs.pop_front();
    }
  }
  // free rest in LIFO order
  while (!ptrs.empty()) {
    pool.free(ptrs.back());
    ptrs.pop_back();
  }
}